

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualizer.cc
# Opt level: O0

void features::Visualizer::draw_keypoint
               (ByteImage *image,Keypoint *keypoint,KeypointStyle style,uint8_t *color)

{
  bool bVar1;
  int x_00;
  int y_00;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *__result;
  double dVar5;
  double dVar6;
  float y1;
  float x1;
  float cos_ori;
  float sin_ori;
  bool draw_orientation;
  int required_space;
  int channels;
  int height;
  int width;
  int y;
  int x;
  uint8_t *color_local;
  KeypointStyle style_local;
  Keypoint *keypoint_local;
  ByteImage *image_local;
  
  x_00 = (int)(keypoint->x + 0.5);
  y_00 = (int)(keypoint->y + 0.5);
  iVar2 = core::ImageBase::width((ImageBase *)image);
  iVar3 = core::ImageBase::height((ImageBase *)image);
  iVar4 = core::ImageBase::channels((ImageBase *)image);
  if ((((-1 < x_00) && (x_00 < iVar2)) && (-1 < y_00)) && (y_00 < iVar3)) {
    switch(style) {
    case RADIUS_BOX_ORIENTATION:
      dVar5 = std::sqrt((double)(ulong)(uint)(keypoint->radius * 2.0 * keypoint->radius));
      sin_ori = (float)((int)SUB84(dVar5,0) + 1);
      bVar1 = true;
      break;
    case RADIUS_CIRCLE_ORIENTATION:
      sin_ori = (float)(int)keypoint->radius;
      bVar1 = true;
      break;
    case SMALL_CIRCLE_STATIC:
      sin_ori = 4.2039e-45;
      bVar1 = false;
      break;
    default:
      sin_ori = 0.0;
      bVar1 = false;
    }
    if (((x_00 < (int)sin_ori) || (iVar2 - (int)sin_ori <= x_00)) ||
       ((y_00 < (int)sin_ori || (color_local._4_4_ = style, iVar3 - (int)sin_ori <= y_00)))) {
      color_local._4_4_ = SMALL_DOT_STATIC;
      sin_ori = 0.0;
      bVar1 = false;
    }
    switch(color_local._4_4_) {
    case RADIUS_BOX_ORIENTATION:
      anon_unknown_0::draw_box
                (image,keypoint->x,keypoint->y,keypoint->radius,keypoint->orientation,color);
      break;
    case RADIUS_CIRCLE_ORIENTATION:
      core::image::draw_circle<unsigned_char>(image,x_00,y_00,(int)sin_ori,color);
      break;
    case SMALL_CIRCLE_STATIC:
      core::image::draw_circle<unsigned_char>(image,x_00,y_00,3,color);
      break;
    default:
      __result = core::Image<unsigned_char>::at(image,x_00,y_00,0);
      std::copy<unsigned_char_const*,unsigned_char*>(color,color + iVar4,__result);
    }
    if (bVar1) {
      dVar5 = std::sin((double)(ulong)(uint)keypoint->orientation);
      dVar6 = std::cos((double)(ulong)(uint)keypoint->orientation);
      core::image::draw_line<unsigned_char>
                (image,(int)(keypoint->x + 0.5),(int)(keypoint->y + 0.5),
                 (int)(keypoint->x + SUB84(dVar6,0) * keypoint->radius + 0.5),
                 (int)(keypoint->y + SUB84(dVar5,0) * keypoint->radius + 0.5),color);
    }
  }
  return;
}

Assistant:

void
Visualizer::draw_keypoint (core::ByteImage& image,
    Visualizer::Keypoint const& keypoint, Visualizer::KeypointStyle style,
    uint8_t const* color)
{
    int const x = static_cast<int>(keypoint.x + 0.5);
    int const y = static_cast<int>(keypoint.y + 0.5);
    int const width = image.width();
    int const height = image.height();
    int const channels = image.channels();

    if (x < 0 || x >= width || y < 0 || y >= height)
        return;

    int required_space = 0;
    bool draw_orientation = false;
    switch (style)
    {
        default:
        case SMALL_DOT_STATIC:
            required_space = 0;
            draw_orientation = false;
            break;
        case SMALL_CIRCLE_STATIC:
            required_space = 3;
            draw_orientation = false;
            break;
        case RADIUS_BOX_ORIENTATION:
            required_space = static_cast<int>(std::sqrt
                (2.0f * keypoint.radius * keypoint.radius)) + 1;
            draw_orientation = true;
            break;
        case RADIUS_CIRCLE_ORIENTATION:
            required_space = static_cast<int>(keypoint.radius);
            draw_orientation = true;
            break;
    }

    if (x < required_space || x >= width - required_space
        || y < required_space || y >= height - required_space)
    {
        style = SMALL_DOT_STATIC;
        required_space = 0;
        draw_orientation = false;
    }

    switch (style)
    {
        default:
        case SMALL_DOT_STATIC:
            std::copy(color, color + channels, &image.at(x, y, 0));
            break;
        case SMALL_CIRCLE_STATIC:
            core::image::draw_circle(image, x, y, 3, color);
            break;
        case RADIUS_BOX_ORIENTATION:
            draw_box(image, keypoint.x, keypoint.y,
                keypoint.radius, keypoint.orientation, color);
            break;
        case RADIUS_CIRCLE_ORIENTATION:
            core::image::draw_circle(image, x, y, required_space, color);
            break;
    }

    if (draw_orientation)
    {
        float const sin_ori = std::sin(keypoint.orientation);
        float const cos_ori = std::cos(keypoint.orientation);
        float const x1 = (cos_ori * keypoint.radius);
        float const y1 = (sin_ori * keypoint.radius);
        core::image::draw_line(image, static_cast<int>(keypoint.x + 0.5f),
            static_cast<int>(keypoint.y + 0.5f),
            static_cast<int>(keypoint.x + x1 + 0.5f),
            static_cast<int>(keypoint.y + y1 + 0.5f), color);
    }
}